

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<float,_1,_0>::calcPartialsPartialsFixedScaling
          (BeagleCPU4StateImpl<float,_1,_0> *this,float *destP,float *partials1,float *matrices1,
          float *partials2,float *matrices2,float *scaleFactors,int startPattern,int endPattern)

{
  float fVar1;
  uint uVar2;
  int iVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar16;
  long lVar17;
  long lVar18;
  int k;
  long lVar19;
  ulong uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [16];
  
  auVar4 = vpmovsxbq_avx(ZEXT216(0xa05));
  auVar5 = vpmovsxbq_avx2(ZEXT416(0x100b0601));
  auVar6 = vpmovsxbq_avx2(ZEXT416(0x110c0702));
  auVar7 = vpmovsxbq_avx2(ZEXT416(0x120d0803));
  uVar2 = (this->super_BeagleCPUImpl<float,_1,_0>).kCategoryCount;
  iVar3 = (this->super_BeagleCPUImpl<float,_1,_0>).kPaddedPatternCount;
  lVar17 = (long)endPattern;
  iVar16 = startPattern * 4;
  for (uVar20 = 0; uVar20 != (~((int)uVar2 >> 0x1f) & uVar2); uVar20 = uVar20 + 1) {
    lVar18 = (long)iVar16;
    auVar31 = vpbroadcastq_avx512vl();
    auVar21 = vpaddq_avx(auVar31._0_16_,auVar4);
    auVar32 = vpbroadcastq_avx512vl();
    vpaddq_avx2(auVar31,auVar5);
    vpaddq_avx2(auVar31,auVar6);
    vpaddq_avx2(auVar31,auVar7);
    auVar8 = vpermq_avx2(ZEXT1632(auVar21),0xd0);
    auVar8 = vpblendd_avx2(auVar8,auVar31,3);
    vpblendd_avx2(auVar8,auVar32,0xc0);
    auVar21 = vgatherqps_avx512vl(*(undefined8 *)(matrices1 + (long)matrices2));
    auVar22 = vgatherqps_avx512vl(*(undefined8 *)(matrices1 + (long)scaleFactors));
    auVar23 = vgatherqps_avx512vl(*(undefined8 *)(matrices1 + lVar17));
    auVar24 = vgatherqps_avx512vl(*(undefined8 *)(matrices1 + lVar18));
    auVar25 = vgatherqps_avx512vl(*(undefined8 *)((long)matrices2 * 5));
    auVar26 = vgatherqps_avx512vl(*(undefined8 *)(matrices2 + (long)scaleFactors));
    auVar27 = vgatherqps_avx512vl(*(undefined8 *)(matrices2 + lVar17));
    auVar28 = vgatherqps_avx512vl(*(undefined8 *)(matrices2 + lVar18));
    for (lVar19 = (long)startPattern; lVar19 < lVar17; lVar19 = lVar19 + 1) {
      fVar1 = partials1[lVar18 + 1];
      auVar29._4_4_ = fVar1;
      auVar29._0_4_ = fVar1;
      auVar29._8_4_ = fVar1;
      auVar29._12_4_ = fVar1;
      auVar29 = vmulps_avx512vl(auVar22,auVar29);
      fVar1 = partials2[lVar18 + 1];
      auVar30._4_4_ = fVar1;
      auVar30._0_4_ = fVar1;
      auVar30._8_4_ = fVar1;
      auVar30._12_4_ = fVar1;
      auVar30 = vmulps_avx512vl(auVar26,auVar30);
      fVar1 = partials1[lVar18];
      auVar9._4_4_ = fVar1;
      auVar9._0_4_ = fVar1;
      auVar9._8_4_ = fVar1;
      auVar9._12_4_ = fVar1;
      auVar29 = vfmadd231ps_avx512vl(auVar29,auVar21,auVar9);
      fVar1 = partials2[lVar18];
      auVar10._4_4_ = fVar1;
      auVar10._0_4_ = fVar1;
      auVar10._8_4_ = fVar1;
      auVar10._12_4_ = fVar1;
      auVar30 = vfmadd231ps_avx512vl(auVar30,auVar25,auVar10);
      fVar1 = partials1[lVar18 + 2];
      auVar11._4_4_ = fVar1;
      auVar11._0_4_ = fVar1;
      auVar11._8_4_ = fVar1;
      auVar11._12_4_ = fVar1;
      auVar29 = vfmadd231ps_avx512vl(auVar29,auVar23,auVar11);
      fVar1 = partials2[lVar18 + 2];
      auVar12._4_4_ = fVar1;
      auVar12._0_4_ = fVar1;
      auVar12._8_4_ = fVar1;
      auVar12._12_4_ = fVar1;
      auVar30 = vfmadd231ps_avx512vl(auVar30,auVar27,auVar12);
      fVar1 = partials1[lVar18 + 3];
      auVar13._4_4_ = fVar1;
      auVar13._0_4_ = fVar1;
      auVar13._8_4_ = fVar1;
      auVar13._12_4_ = fVar1;
      auVar29 = vfmadd231ps_avx512vl(auVar29,auVar24,auVar13);
      fVar1 = partials2[lVar18 + 3];
      auVar14._4_4_ = fVar1;
      auVar14._0_4_ = fVar1;
      auVar14._8_4_ = fVar1;
      auVar14._12_4_ = fVar1;
      auVar30 = vfmadd231ps_avx512vl(auVar30,auVar28,auVar14);
      auVar33._0_4_ = auVar29._0_4_ * auVar30._0_4_;
      auVar33._4_4_ = auVar29._4_4_ * auVar30._4_4_;
      auVar33._8_4_ = auVar29._8_4_ * auVar30._8_4_;
      auVar33._12_4_ = auVar29._12_4_ * auVar30._12_4_;
      fVar1 = scaleFactors[lVar19];
      auVar15._4_4_ = fVar1;
      auVar15._0_4_ = fVar1;
      auVar15._8_4_ = fVar1;
      auVar15._12_4_ = fVar1;
      auVar29 = vdivps_avx512vl(auVar33,auVar15);
      *(undefined1 (*) [16])(destP + lVar18) = auVar29;
      lVar18 = lVar18 + 4;
    }
    iVar16 = iVar16 + iVar3 * 4;
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcPartialsPartialsFixedScaling(REALTYPE* destP,
                                                                               const REALTYPE* partials1,
                                                                               const REALTYPE* matrices1,
                                                                               const REALTYPE* partials2,
                                                                               const REALTYPE* matrices2,
                                                                               const REALTYPE* scaleFactors,
                                                                               int startPattern,
                                                                               int endPattern) {

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int u = l*4*kPaddedPatternCount;
        if (startPattern != 0) {
          u += 4*startPattern;
        }

        int w = l*4*OFFSET;

        PREFETCH_MATRIX(1,matrices1,w);
        PREFETCH_MATRIX(2,matrices2,w);

        for (int k = startPattern; k < endPattern; k++) {

            // Prefetch scale factor
            const REALTYPE scaleFactor = scaleFactors[k];

            PREFETCH_PARTIALS(1,partials1,u);
            PREFETCH_PARTIALS(2,partials2,u);

            DO_INTEGRATION(1); // defines sum10, sum11, sum12, sum13
            DO_INTEGRATION(2); // defines sum20, sum21, sum22, sum23

            // Final results
            destP[u    ] = sum10 * sum20 / scaleFactor;
            destP[u + 1] = sum11 * sum21 / scaleFactor;
            destP[u + 2] = sum12 * sum22 / scaleFactor;
            destP[u + 3] = sum13 * sum23 / scaleFactor;

            u += 4;
        }
    }
}